

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::jsescape::operator()(jsescape *this,ostream *out)

{
  ostream *in_RDI;
  jsescape_buf sb;
  jsescape_buf *this_00;
  jsescape_buf local_e8;
  
  this_00 = &local_e8;
  anon_unknown_0::jsescape_buf::jsescape_buf(this_00);
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::steal
            (&this_00->super_filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>,
             in_RDI);
  streamable::operator()((streamable *)this_00,in_RDI);
  util::filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>::release
            (&this_00->super_filterbuf<cppcms::filters::(anonymous_namespace)::jsescape_buf,_128>);
  anon_unknown_0::jsescape_buf::~jsescape_buf((jsescape_buf *)0x40bbdf);
  return;
}

Assistant:

void jsescape::operator()(std::ostream &out) const
	{
		jsescape_buf sb;
		sb.steal(out);
		obj_(out);
		sb.release();
	}